

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBufferDescriptor.h
# Opt level: O2

void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(int32_t termLength)

{
  IllegalStateException *pIVar1;
  char *pcVar2;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (termLength < 0x10000) {
    pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_f8,0x10000);
    std::operator+(&local_d8,"term length less than min size of ",&local_f8);
    std::operator+(&local_b8,&local_d8,", length=");
    std::__cxx11::to_string(&local_58,termLength);
    std::operator+(&local_98,&local_b8,&local_58);
    std::__cxx11::string::string
              ((string *)&local_78,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,&local_f9);
    pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                              );
    std::__cxx11::string::string((string *)&local_38,pcVar2,&local_fa);
    util::IllegalStateException::IllegalStateException(pIVar1,&local_98,&local_78,&local_38,0x9c);
    __cxa_throw(pIVar1,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if ((uint)termLength < 0x40000001) {
    if ((termLength + 0x7fffffffU & termLength) == 0) {
      return;
    }
    pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_b8,termLength);
    std::operator+(&local_98,"term length not a power of 2, length=",&local_b8);
    std::__cxx11::string::string
              ((string *)&local_d8,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,(allocator *)&local_58);
    pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                              );
    std::__cxx11::string::string((string *)&local_f8,pcVar2,(allocator *)&local_78);
    util::IllegalStateException::IllegalStateException(pIVar1,&local_98,&local_d8,&local_f8,0xa9);
    __cxa_throw(pIVar1,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_f8,0x40000000);
  std::operator+(&local_d8,"term length greater than max size of ",&local_f8);
  std::operator+(&local_b8,&local_d8,", length=");
  std::__cxx11::to_string(&local_58,termLength);
  std::operator+(&local_98,&local_b8,&local_58);
  std::__cxx11::string::string
            ((string *)&local_78,
             "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
             ,&local_f9);
  pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_fa);
  util::IllegalStateException::IllegalStateException(pIVar1,&local_98,&local_78,&local_38,0xa3);
  __cxa_throw(pIVar1,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void checkTermLength(std::int32_t termLength)
{
    if (termLength < TERM_MIN_LENGTH)
    {
        throw util::IllegalStateException(
            "term length less than min size of " + std::to_string(TERM_MIN_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (termLength > TERM_MAX_LENGTH)
    {
        throw util::IllegalStateException(
            "term length greater than max size of " + std::to_string(TERM_MAX_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (!util::BitUtil::isPowerOfTwo(termLength))
    {
        throw util::IllegalStateException(
            "term length not a power of 2, length=" + std::to_string(termLength), SOURCEINFO);
    }
}